

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

int equal_dimensions_and_border(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((((a->field_1).field_0.y_height == (b->field_1).field_0.y_height) &&
       ((a->field_0).field_0.y_width == (b->field_0).field_0.y_width)) &&
      ((a->field_1).field_0.uv_height == (b->field_1).field_0.uv_height)) &&
     ((((a->field_0).field_0.uv_width == (b->field_0).field_0.uv_width &&
       ((a->field_4).field_0.y_stride == (b->field_4).field_0.y_stride)) &&
      (((a->field_4).field_0.uv_stride == (b->field_4).field_0.uv_stride && (a->border == b->border)
       ))))) {
    uVar1 = (uint)(((b->flags ^ a->flags) & 8U) == 0);
  }
  return uVar1;
}

Assistant:

static int equal_dimensions_and_border(const YV12_BUFFER_CONFIG *a,
                                       const YV12_BUFFER_CONFIG *b) {
  return a->y_height == b->y_height && a->y_width == b->y_width &&
         a->uv_height == b->uv_height && a->uv_width == b->uv_width &&
         a->y_stride == b->y_stride && a->uv_stride == b->uv_stride &&
         a->border == b->border &&
         (a->flags & YV12_FLAG_HIGHBITDEPTH) ==
             (b->flags & YV12_FLAG_HIGHBITDEPTH);
}